

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperSTREQ
          (internal *this,char *lhs_expression,char *rhs_expression,wchar_t *lhs,wchar_t *rhs)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  AssertionResult AVar3;
  wchar_t *local_68;
  wchar_t *local_60;
  string local_58;
  string local_38;
  
  local_68 = rhs;
  local_60 = lhs;
  bVar1 = String::WideCStringEquals(lhs,rhs);
  if (bVar1) {
    *this = (internal)0x1;
    *(undefined8 *)(this + 8) = 0;
    sVar2.ptr_ = value;
  }
  else {
    PrintToString<wchar_t_const*>(&local_38,(testing *)&local_60,(wchar_t **)value);
    PrintToString<wchar_t_const*>(&local_58,(testing *)&local_68,value_00);
    EqFailure(this,lhs_expression,rhs_expression,&local_38,&local_58,false);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTREQ(const char* lhs_expression,
                               const char* rhs_expression,
                               const wchar_t* lhs,
                               const wchar_t* rhs) {
  if (String::WideCStringEquals(lhs, rhs)) {
    return AssertionSuccess();
  }

  return EqFailure(lhs_expression,
                   rhs_expression,
                   PrintToString(lhs),
                   PrintToString(rhs),
                   false);
}